

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::ResizeCspTest_TestResizeCspWorks_Test>::CreateTest
          (ParameterizedTestFactory<(anonymous_namespace)::ResizeCspTest_TestResizeCspWorks_Test>
           *this)

{
  ResizeTest *this_00;
  
  WithParamInterface<std::tuple<libaom_test::CodecFactory_const*,libaom_test::TestMode>>::parameter_
       = &this->parameter_;
  this_00 = (ResizeTest *)operator_new(0x418);
  anon_unknown.dwarf_19cdc37::ResizeTest::ResizeTest(this_00);
  this_00[1].super_CodecTestWithParam<libaom_test::TestMode>.
  super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode>_>.
  super_Test._vptr_Test = (_func_int **)0x0;
  (this_00->super_CodecTestWithParam<libaom_test::TestMode>).
  super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode>_>.
  super_Test._vptr_Test = (_func_int **)&PTR__ResizeTest_01047408;
  (this_00->super_CodecTestWithParam<libaom_test::TestMode>).
  super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode>_>.
  super_WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode>_>.
  _vptr_WithParamInterface = (_func_int **)&DAT_01047470;
  (this_00->super_EncoderTest)._vptr_EncoderTest =
       (_func_int **)&PTR__ResizeCspTest_TestResizeCspWorks_Test_01047490;
  return (Test *)this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }